

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int __thiscall pstore::file::file_handle::truncate(file_handle *this,char *__file,__off_t __length)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->file_ == -1) {
    raise<std::errc>(bad_file_descriptor);
  }
  if (-1 < (long)__file) {
    iVar2 = ftruncate(this->file_,(__off_t)__file);
    if (iVar2 != -1) {
      return iVar2;
    }
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    pcVar1 = (this->path_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->path_)._M_string_length);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar2,"ftruncate failed",&local_38);
  }
  raise<std::errc,char[9]>(invalid_argument,(char (*) [9])"truncate");
}

Assistant:

void file_handle::truncate (std::uint64_t const size) {
            this->ensure_open ();
            if (size > uoff_max) {
                raise (std::errc::invalid_argument, "truncate");
            }
            if (::ftruncate (file_, static_cast<off_t> (size)) == -1) {
                int const err = errno;
                raise_file_error (err, "ftruncate failed", this->path ());
            }
        }